

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

int tcv_destroy(tcv_t *tcv)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    if (tcv->data != (void *)0x0) {
      free(tcv->data);
      tcv->data = (void *)0x0;
      tcv->created = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    pthread_mutex_destroy((pthread_mutex_t *)&tcv->lock);
    free(tcv);
    iVar2 = 0;
  }
  else {
    iVar2 = -4;
  }
  return iVar2;
}

Assistant:

int tcv_destroy(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
		tcv->created = false;
	}
	tcv_unlock(tcv);
	pthread_mutex_destroy(&tcv->lock);
	free(tcv);

	return ret;
}